

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.c
# Opt level: O0

xmlURIPtr xmlParseURIRaw(char *str,int raw)

{
  int iVar1;
  int ret;
  xmlURIPtr uri;
  int raw_local;
  char *str_local;
  
  if (str == (char *)0x0) {
    str_local = (char *)0x0;
  }
  else {
    str_local = (char *)xmlCreateURI();
    if ((xmlURIPtr)str_local != (xmlURIPtr)0x0) {
      if (raw != 0) {
        ((xmlURIPtr)str_local)->cleanup = ((xmlURIPtr)str_local)->cleanup | 2;
      }
      iVar1 = xmlParseURIReference((xmlURIPtr)str_local,str);
      if (iVar1 != 0) {
        xmlFreeURI((xmlURIPtr)str_local);
        str_local = (char *)0x0;
      }
    }
  }
  return (xmlURIPtr)str_local;
}

Assistant:

xmlURIPtr
xmlParseURIRaw(const char *str, int raw) {
    xmlURIPtr uri;
    int ret;

    if (str == NULL)
	return(NULL);
    uri = xmlCreateURI();
    if (uri != NULL) {
        if (raw) {
	    uri->cleanup |= 2;
	}
	ret = xmlParseURIReference(uri, str);
        if (ret) {
	    xmlFreeURI(uri);
	    return(NULL);
	}
    }
    return(uri);
}